

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.cpp
# Opt level: O0

void __thiscall smf::MidiEvent::MidiEvent(MidiEvent *this,MidiEvent *mfevent)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  int local_28;
  int i;
  MidiEvent *mfevent_local;
  MidiEvent *this_local;
  
  MidiMessage::MidiMessage(&this->super_MidiMessage);
  this->track = mfevent->track;
  this->tick = mfevent->tick;
  this->seconds = mfevent->seconds;
  this->seq = mfevent->seq;
  this->m_eventlink = (MidiEvent *)0x0;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)mfevent);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,sVar2);
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
    if ((int)sVar2 <= local_28) break;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)mfevent,
                        (long)local_28);
    vVar1 = *pvVar3;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,(long)local_28
                       );
    *pvVar4 = vVar1;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

MidiEvent::MidiEvent(const MidiEvent& mfevent) : MidiMessage() {
	track   = mfevent.track;
	tick    = mfevent.tick;
	seconds = mfevent.seconds;
	seq     = mfevent.seq;
	m_eventlink = NULL;

	this->resize(mfevent.size());
	for (int i=0; i<(int)this->size(); i++) {
		(*this)[i] = mfevent[i];
	}
}